

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_257,_false,_embree::sse2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  ulong uVar15;
  RayQueryContext *extraout_RDX;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  vfloat4 a0;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [12];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  vfloat4 a;
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar91;
  undefined1 auVar86 [16];
  float fVar90;
  float fVar92;
  undefined1 auVar87 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1098 [16];
  ulong local_1088;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_fd8 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar26 = (ray->super_RayK<1>).dir.field_0.m128[1];
    local_fc8 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar28 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar25 = fVar26 * fVar26;
    fVar27 = local_fc8 * local_fc8;
    fVar29 = fVar28 * fVar28;
    fVar46 = fVar25 + local_fd8 * local_fd8 + fVar27;
    auVar54._0_8_ = CONCAT44(fVar25 + fVar25 + fVar29,fVar46);
    auVar54._8_4_ = fVar25 + fVar27 + fVar27;
    auVar54._12_4_ = fVar25 + fVar29 + fVar29;
    auVar42._8_4_ = auVar54._8_4_;
    auVar42._0_8_ = auVar54._0_8_;
    auVar42._12_4_ = auVar54._12_4_;
    auVar54 = rsqrtss(auVar42,auVar54);
    fVar25 = auVar54._0_4_;
    local_fb8[0] = fVar25 * 1.5 - fVar25 * fVar25 * fVar46 * 0.5 * fVar25;
    fVar25 = local_fd8 * local_fb8[0];
    fVar27 = fVar26 * local_fb8[0];
    fVar29 = local_fc8 * local_fb8[0];
    fVar74 = -fVar27;
    fVar46 = -fVar29;
    auVar68._8_4_ = 0xffffffff;
    auVar68._0_8_ = 0xffffffffffffffff;
    if (fVar74 * fVar74 + fVar29 * fVar29 + 0.0 <= fVar25 * fVar25 + fVar46 * fVar46 + 0.0) {
      auVar68 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar65 = (float)((uint)fVar29 & auVar68._4_4_);
    fVar46 = (float)(~auVar68._0_4_ & (uint)fVar46);
    fVar67 = (float)(~auVar68._8_4_ & (uint)fVar25 | (uint)fVar74 & auVar68._8_4_);
    fVar74 = fVar65 * fVar65;
    fVar66 = fVar67 * fVar67;
    fVar75 = fVar74 + fVar46 * fVar46 + fVar66;
    auVar70._0_8_ = CONCAT44(fVar74 + fVar74 + 0.0,fVar75);
    auVar70._8_4_ = fVar74 + fVar66 + fVar66;
    auVar70._12_4_ = fVar74 + 0.0 + 0.0;
    auVar76._8_4_ = auVar70._8_4_;
    auVar76._0_8_ = auVar70._0_8_;
    auVar76._12_4_ = auVar70._12_4_;
    auVar54 = rsqrtss(auVar76,auVar70);
    fVar74 = auVar54._0_4_;
    fVar74 = fVar74 * 1.5 - fVar74 * fVar74 * fVar75 * 0.5 * fVar74;
    fVar46 = fVar74 * fVar46;
    fVar65 = fVar74 * fVar65;
    fVar67 = fVar74 * fVar67;
    fVar66 = fVar65 * fVar25 - fVar27 * fVar46;
    fVar75 = fVar67 * fVar27 - fVar29 * fVar65;
    fVar71 = fVar46 * fVar29 - fVar25 * fVar67;
    fVar73 = fVar74 * 0.0 * fVar28 * local_fb8[0] - fVar28 * local_fb8[0] * fVar74 * 0.0;
    fVar74 = fVar75 * fVar75;
    fVar72 = fVar71 * fVar71;
    fVar73 = fVar73 * fVar73;
    fVar77 = fVar72 + fVar74 + fVar66 * fVar66;
    fVar78 = fVar73 + fVar74 + fVar74;
    fVar72 = fVar72 + fVar74 + fVar72;
    fVar73 = fVar73 + fVar74 + fVar73;
    auVar64._4_4_ = fVar78;
    auVar64._0_4_ = fVar77;
    auVar64._8_4_ = fVar72;
    auVar64._12_4_ = fVar73;
    auVar49._4_4_ = fVar78;
    auVar49._0_4_ = fVar77;
    auVar49._8_4_ = fVar72;
    auVar49._12_4_ = fVar73;
    auVar54 = rsqrtss(auVar64,auVar49);
    fVar74 = auVar54._0_4_;
    fVar74 = fVar74 * 1.5 - fVar74 * fVar74 * fVar77 * 0.5 * fVar74;
    local_f88._4_4_ = fVar74 * fVar66;
    local_f88._0_4_ = fVar67;
    local_f88._8_4_ = local_fb8[0] * fVar29;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar74 * fVar71;
    local_f98._0_4_ = fVar65;
    local_f98._8_4_ = local_fb8[0] * fVar27;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar74 * fVar75;
    local_fa8._0_4_ = fVar46;
    local_fa8._8_4_ = local_fb8[0] * fVar25;
    local_fa8._12_4_ = 0;
    pauVar18 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
    local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_1008 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar27 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar25 = (ray->super_RayK<1>).tfar;
    fVar29 = 0.0;
    if (0.0 <= fVar25) {
      fVar29 = fVar25;
    }
    local_1018 = 0.0;
    if (0.0 <= fVar27) {
      local_1018 = fVar27;
    }
    uVar21 = -(uint)((float)DAT_01f4bd50 <= ABS(local_fd8));
    uVar22 = -(uint)(DAT_01f4bd50._4_4_ <= ABS(fVar26));
    uVar23 = -(uint)(DAT_01f4bd50._8_4_ <= ABS(local_fc8));
    uVar24 = -(uint)(DAT_01f4bd50._12_4_ <= ABS(fVar28));
    auVar47._0_4_ = (uint)local_fd8 & uVar21;
    auVar47._4_4_ = (uint)fVar26 & uVar22;
    auVar47._8_4_ = (uint)local_fc8 & uVar23;
    auVar47._12_4_ = (uint)fVar28 & uVar24;
    auVar39._0_4_ = ~uVar21 & (uint)(float)DAT_01f4bd50;
    auVar39._4_4_ = ~uVar22 & (uint)DAT_01f4bd50._4_4_;
    auVar39._8_4_ = ~uVar23 & (uint)DAT_01f4bd50._8_4_;
    auVar39._12_4_ = ~uVar24 & (uint)DAT_01f4bd50._12_4_;
    auVar39 = auVar39 | auVar47;
    auVar54 = rcpps(auVar47,auVar39);
    local_1058 = auVar54._0_4_;
    local_1068 = auVar54._4_4_;
    local_1028 = auVar54._8_4_;
    local_1058 = (1.0 - auVar39._0_4_ * local_1058) * local_1058 + local_1058;
    local_1068 = (1.0 - auVar39._4_4_ * local_1068) * local_1068 + local_1068;
    local_1028 = (1.0 - auVar39._8_4_ * local_1028) * local_1028 + local_1028;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    local_fe8._4_4_ = fVar26;
    local_fe8._0_4_ = fVar26;
    fStack_fe0 = fVar26;
    fStack_fdc = fVar26;
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
    uVar16 = (ulong)(local_1058 < 0.0) << 4;
    uVar19 = (ulong)(local_1068 < 0.0) << 4 | 0x20;
    uVar20 = (ulong)(local_1028 < 0.0) << 4 | 0x40;
    local_1080 = ray;
    fStack_1004 = local_1008;
    fStack_1000 = local_1008;
    fStack_ffc = local_1008;
    fStack_1014 = local_1018;
    fStack_1010 = local_1018;
    fStack_100c = local_1018;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    local_1088 = uVar16;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    uVar17 = uVar16;
    fVar26 = fVar29;
    fVar28 = fVar29;
    fVar25 = fVar29;
    fVar27 = local_1018;
    fVar46 = local_1018;
    fVar74 = local_1018;
    fVar65 = local_1018;
    fVar66 = local_1058;
    fVar67 = local_1058;
    fVar75 = local_1058;
    fVar71 = local_1058;
    fVar72 = local_1038;
    fVar73 = local_1038;
    fVar77 = local_1038;
    fVar78 = local_1038;
    fVar95 = local_1048;
    fVar96 = local_1048;
    fVar97 = local_1048;
    fVar98 = local_1048;
    fVar90 = local_1008;
    fVar92 = local_1008;
    fVar93 = local_1008;
    fVar94 = local_1008;
    fVar79 = local_1028;
    fVar82 = local_1028;
    fVar83 = local_1028;
    fVar84 = local_1028;
    fVar85 = local_1068;
    fVar88 = local_1068;
    fVar89 = local_1068;
    fVar91 = local_1068;
LAB_00566422:
    if (pauVar18 != (undefined1 (*) [16])&local_f78) {
      pauVar13 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar13 + 8) < *pfVar1 || *(float *)((long)*pauVar13 + 8) == *pfVar1) {
        uVar14 = *(ulong *)*pauVar18;
LAB_00566447:
        if ((uVar14 & 0xf) == 0) {
          pfVar1 = (float *)(uVar14 + 0x20 + uVar17);
          auVar30._0_4_ = (*pfVar1 - fVar72) * fVar66;
          auVar30._4_4_ = (pfVar1[1] - fVar73) * fVar67;
          auVar30._8_4_ = (pfVar1[2] - fVar77) * fVar75;
          auVar30._12_4_ = (pfVar1[3] - fVar78) * fVar71;
          pfVar1 = (float *)(uVar14 + 0x20 + uVar19);
          auVar40._0_4_ = (*pfVar1 - fVar95) * fVar85;
          auVar40._4_4_ = (pfVar1[1] - fVar96) * fVar88;
          auVar40._8_4_ = (pfVar1[2] - fVar97) * fVar89;
          auVar40._12_4_ = (pfVar1[3] - fVar98) * fVar91;
          auVar54 = maxps(auVar30,auVar40);
          pfVar1 = (float *)(uVar14 + 0x20 + uVar20);
          auVar41._0_4_ = (*pfVar1 - fVar90) * fVar79;
          auVar41._4_4_ = (pfVar1[1] - fVar92) * fVar82;
          auVar41._8_4_ = (pfVar1[2] - fVar93) * fVar83;
          auVar41._12_4_ = (pfVar1[3] - fVar94) * fVar84;
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar16 ^ 0x10));
          auVar48._0_4_ = (*pfVar1 - fVar72) * fVar66;
          auVar48._4_4_ = (pfVar1[1] - fVar73) * fVar67;
          auVar48._8_4_ = (pfVar1[2] - fVar77) * fVar75;
          auVar48._12_4_ = (pfVar1[3] - fVar78) * fVar71;
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar19 ^ 0x10));
          auVar55._0_4_ = (*pfVar1 - fVar95) * fVar85;
          auVar55._4_4_ = (pfVar1[1] - fVar96) * fVar88;
          auVar55._8_4_ = (pfVar1[2] - fVar97) * fVar89;
          auVar55._12_4_ = (pfVar1[3] - fVar98) * fVar91;
          auVar49 = minps(auVar48,auVar55);
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar20 ^ 0x10));
          auVar56._0_4_ = (*pfVar1 - fVar90) * fVar79;
          auVar56._4_4_ = (pfVar1[1] - fVar92) * fVar82;
          auVar56._8_4_ = (pfVar1[2] - fVar93) * fVar83;
          auVar56._12_4_ = (pfVar1[3] - fVar94) * fVar84;
          auVar7._4_4_ = fVar46;
          auVar7._0_4_ = fVar27;
          auVar7._8_4_ = fVar74;
          auVar7._12_4_ = fVar65;
          auVar42 = maxps(auVar41,auVar7);
          local_1098 = maxps(auVar54,auVar42);
          auVar6._4_4_ = fVar26;
          auVar6._0_4_ = fVar29;
          auVar6._8_4_ = fVar28;
          auVar6._12_4_ = fVar25;
          auVar54 = minps(auVar56,auVar6);
          auVar54 = minps(auVar49,auVar54);
          auVar31._4_4_ = -(uint)(local_1098._4_4_ <= auVar54._4_4_);
          auVar31._0_4_ = -(uint)(local_1098._0_4_ <= auVar54._0_4_);
          auVar31._8_4_ = -(uint)(local_1098._8_4_ <= auVar54._8_4_);
          auVar31._12_4_ = -(uint)(local_1098._12_4_ <= auVar54._12_4_);
          uVar21 = movmskps((int)context,auVar31);
        }
        else {
          if ((int)(uVar14 & 0xf) != 2) {
            (**(code **)((long)local_1078->leafIntersector +
                        (ulong)*(byte *)(uVar14 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1070);
            fVar29 = (local_1080->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1080;
            uVar17 = local_1088;
            fVar26 = fVar29;
            fVar28 = fVar29;
            fVar25 = fVar29;
            fVar27 = local_1018;
            fVar46 = fStack_1014;
            fVar74 = fStack_1010;
            fVar65 = fStack_100c;
            fVar66 = local_1058;
            fVar67 = fStack_1054;
            fVar75 = fStack_1050;
            fVar71 = fStack_104c;
            fVar72 = local_1038;
            fVar73 = fStack_1034;
            fVar77 = fStack_1030;
            fVar78 = fStack_102c;
            fVar95 = local_1048;
            fVar96 = fStack_1044;
            fVar97 = fStack_1040;
            fVar98 = fStack_103c;
            fVar90 = local_1008;
            fVar92 = fStack_1004;
            fVar93 = fStack_1000;
            fVar94 = fStack_ffc;
            fVar79 = local_1028;
            fVar82 = fStack_1024;
            fVar83 = fStack_1020;
            fVar84 = fStack_101c;
            fVar85 = local_1068;
            fVar88 = fStack_1064;
            fVar89 = fStack_1060;
            fVar91 = fStack_105c;
            goto LAB_00566422;
          }
          uVar15 = uVar14 & 0xfffffffffffffff0;
          local_ff8 = *(float *)(uVar15 + 0x70);
          fStack_ff4 = *(float *)(uVar15 + 0x74);
          fStack_ff0 = *(float *)(uVar15 + 0x78);
          fStack_fec = *(float *)(uVar15 + 0x7c);
          fVar95 = local_fd8 * *(float *)(uVar15 + 0x20) +
                   (float)local_fe8._0_4_ * *(float *)(uVar15 + 0x50) +
                   local_fc8 * *(float *)(uVar15 + 0x80);
          fVar96 = fStack_fd4 * *(float *)(uVar15 + 0x24) +
                   (float)local_fe8._4_4_ * *(float *)(uVar15 + 0x54) +
                   fStack_fc4 * *(float *)(uVar15 + 0x84);
          fVar97 = fStack_fd0 * *(float *)(uVar15 + 0x28) +
                   fStack_fe0 * *(float *)(uVar15 + 0x58) + fStack_fc0 * *(float *)(uVar15 + 0x88);
          fVar98 = fStack_fcc * *(float *)(uVar15 + 0x2c) +
                   fStack_fdc * *(float *)(uVar15 + 0x5c) + fStack_fbc * *(float *)(uVar15 + 0x8c);
          fVar27 = local_fd8 * *(float *)(uVar15 + 0x30) +
                   (float)local_fe8._0_4_ * *(float *)(uVar15 + 0x60) +
                   local_fc8 * *(float *)(uVar15 + 0x90);
          fVar46 = fStack_fd4 * *(float *)(uVar15 + 0x34) +
                   (float)local_fe8._4_4_ * *(float *)(uVar15 + 100) +
                   fStack_fc4 * *(float *)(uVar15 + 0x94);
          fVar74 = fStack_fd0 * *(float *)(uVar15 + 0x38) +
                   fStack_fe0 * *(float *)(uVar15 + 0x68) + fStack_fc0 * *(float *)(uVar15 + 0x98);
          fVar65 = fStack_fcc * *(float *)(uVar15 + 0x3c) +
                   fStack_fdc * *(float *)(uVar15 + 0x6c) + fStack_fbc * *(float *)(uVar15 + 0x9c);
          fVar66 = local_fd8 * *(float *)(uVar15 + 0x40) +
                   (float)local_fe8._0_4_ * local_ff8 + local_fc8 * *(float *)(uVar15 + 0xa0);
          fVar67 = fStack_fd4 * *(float *)(uVar15 + 0x44) +
                   (float)local_fe8._4_4_ * fStack_ff4 + fStack_fc4 * *(float *)(uVar15 + 0xa4);
          fVar75 = fStack_fd0 * *(float *)(uVar15 + 0x48) +
                   fStack_fe0 * fStack_ff0 + fStack_fc0 * *(float *)(uVar15 + 0xa8);
          fVar71 = fStack_fcc * *(float *)(uVar15 + 0x4c) +
                   fStack_fdc * fStack_fec + fStack_fbc * *(float *)(uVar15 + 0xac);
          fVar72 = (float)DAT_01f4bd50;
          fVar73 = DAT_01f4bd50._4_4_;
          fVar77 = DAT_01f4bd50._8_4_;
          fVar78 = DAT_01f4bd50._12_4_;
          uVar21 = -(uint)(fVar72 <= ABS(fVar95));
          uVar22 = -(uint)(fVar73 <= ABS(fVar96));
          uVar23 = -(uint)(fVar77 <= ABS(fVar97));
          uVar24 = -(uint)(fVar78 <= ABS(fVar98));
          auVar80._0_4_ = ~uVar21 & (uint)fVar72;
          auVar80._4_4_ = ~uVar22 & (uint)fVar73;
          auVar80._8_4_ = ~uVar23 & (uint)fVar77;
          auVar80._12_4_ = ~uVar24 & (uint)fVar78;
          auVar11._4_4_ = (uint)fVar96 & uVar22;
          auVar11._0_4_ = (uint)fVar95 & uVar21;
          auVar11._8_4_ = (uint)fVar97 & uVar23;
          auVar11._12_4_ = (uint)fVar98 & uVar24;
          auVar80 = auVar80 | auVar11;
          uVar21 = -(uint)(fVar72 <= ABS(fVar27));
          uVar22 = -(uint)(fVar73 <= ABS(fVar46));
          uVar23 = -(uint)(fVar77 <= ABS(fVar74));
          uVar24 = -(uint)(fVar78 <= ABS(fVar65));
          auVar32._0_4_ = (uint)fVar27 & uVar21;
          auVar32._4_4_ = (uint)fVar46 & uVar22;
          auVar32._8_4_ = (uint)fVar74 & uVar23;
          auVar32._12_4_ = (uint)fVar65 & uVar24;
          auVar86._0_4_ = ~uVar21 & (uint)fVar72;
          auVar86._4_4_ = ~uVar22 & (uint)fVar73;
          auVar86._8_4_ = ~uVar23 & (uint)fVar77;
          auVar86._12_4_ = ~uVar24 & (uint)fVar78;
          auVar86 = auVar86 | auVar32;
          uVar21 = -(uint)(fVar72 <= ABS(fVar66));
          uVar22 = -(uint)(fVar73 <= ABS(fVar67));
          uVar23 = -(uint)(fVar77 <= ABS(fVar75));
          uVar24 = -(uint)(fVar78 <= ABS(fVar71));
          auVar33._0_4_ = ~uVar21 & (uint)fVar72;
          auVar33._4_4_ = ~uVar22 & (uint)fVar73;
          auVar33._8_4_ = ~uVar23 & (uint)fVar77;
          auVar33._12_4_ = ~uVar24 & (uint)fVar78;
          auVar8._4_4_ = (uint)fVar67 & uVar22;
          auVar8._0_4_ = (uint)fVar66 & uVar21;
          auVar8._8_4_ = (uint)fVar75 & uVar23;
          auVar8._12_4_ = (uint)fVar71 & uVar24;
          auVar33 = auVar33 | auVar8;
          auVar54 = rcpps(_DAT_01f4bd50,auVar80);
          fVar75 = auVar54._0_4_;
          fVar71 = auVar54._4_4_;
          fVar72 = auVar54._8_4_;
          fVar73 = auVar54._12_4_;
          fVar75 = (1.0 - auVar80._0_4_ * fVar75) * fVar75 + fVar75;
          fVar71 = (1.0 - auVar80._4_4_ * fVar71) * fVar71 + fVar71;
          fVar72 = (1.0 - auVar80._8_4_ * fVar72) * fVar72 + fVar72;
          fVar73 = (1.0 - auVar80._12_4_ * fVar73) * fVar73 + fVar73;
          auVar54 = rcpps(auVar54,auVar86);
          fVar77 = auVar54._0_4_;
          fVar78 = auVar54._4_4_;
          fVar95 = auVar54._8_4_;
          fVar96 = auVar54._12_4_;
          fVar77 = (1.0 - auVar86._0_4_ * fVar77) * fVar77 + fVar77;
          fVar78 = (1.0 - auVar86._4_4_ * fVar78) * fVar78 + fVar78;
          fVar95 = (1.0 - auVar86._8_4_ * fVar95) * fVar95 + fVar95;
          fVar96 = (1.0 - auVar86._12_4_ * fVar96) * fVar96 + fVar96;
          auVar54 = rcpps(auVar54,auVar33);
          fVar97 = auVar54._0_4_;
          fVar98 = auVar54._4_4_;
          fVar90 = auVar54._8_4_;
          fVar92 = auVar54._12_4_;
          fVar97 = (1.0 - auVar33._0_4_ * fVar97) * fVar97 + fVar97;
          fVar98 = (1.0 - auVar33._4_4_ * fVar98) * fVar98 + fVar98;
          fVar90 = (1.0 - auVar33._8_4_ * fVar90) * fVar90 + fVar90;
          fVar92 = (1.0 - auVar33._12_4_ * fVar92) * fVar92 + fVar92;
          uVar21 = (uint)DAT_01f46720;
          uVar22 = DAT_01f46720._4_4_;
          uVar23 = DAT_01f46720._8_4_;
          uVar24 = DAT_01f46720._12_4_;
          fVar66 = (*(float *)(uVar15 + 0x20) * local_1038 +
                   *(float *)(uVar15 + 0x50) * local_1048 +
                   *(float *)(uVar15 + 0x80) * local_1008 + *(float *)(uVar15 + 0xb0)) *
                   (float)((uint)fVar75 ^ uVar21);
          fVar67 = (*(float *)(uVar15 + 0x24) * fStack_1034 +
                   *(float *)(uVar15 + 0x54) * fStack_1044 +
                   *(float *)(uVar15 + 0x84) * fStack_1004 + *(float *)(uVar15 + 0xb4)) *
                   (float)((uint)fVar71 ^ uVar22);
          auVar62._0_8_ = CONCAT44(fVar67,fVar66);
          auVar62._8_4_ =
               (*(float *)(uVar15 + 0x28) * fStack_1030 +
               *(float *)(uVar15 + 0x58) * fStack_1040 +
               *(float *)(uVar15 + 0x88) * fStack_1000 + *(float *)(uVar15 + 0xb8)) *
               (float)((uint)fVar72 ^ uVar23);
          auVar62._12_4_ =
               (*(float *)(uVar15 + 0x2c) * fStack_102c +
               *(float *)(uVar15 + 0x5c) * fStack_103c +
               *(float *)(uVar15 + 0x8c) * fStack_ffc + *(float *)(uVar15 + 0xbc)) *
               (float)((uint)fVar73 ^ uVar24);
          fVar27 = (*(float *)(uVar15 + 0x30) * local_1038 +
                   *(float *)(uVar15 + 0x60) * local_1048 +
                   *(float *)(uVar15 + 0x90) * local_1008 + *(float *)(uVar15 + 0xc0)) *
                   (float)((uint)fVar77 ^ uVar21);
          fVar46 = (*(float *)(uVar15 + 0x34) * fStack_1034 +
                   *(float *)(uVar15 + 100) * fStack_1044 +
                   *(float *)(uVar15 + 0x94) * fStack_1004 + *(float *)(uVar15 + 0xc4)) *
                   (float)((uint)fVar78 ^ uVar22);
          auVar43._0_8_ = CONCAT44(fVar46,fVar27);
          auVar43._8_4_ =
               (*(float *)(uVar15 + 0x38) * fStack_1030 +
               *(float *)(uVar15 + 0x68) * fStack_1040 +
               *(float *)(uVar15 + 0x98) * fStack_1000 + *(float *)(uVar15 + 200)) *
               (float)((uint)fVar95 ^ uVar23);
          auVar43._12_4_ =
               (*(float *)(uVar15 + 0x3c) * fStack_102c +
               *(float *)(uVar15 + 0x6c) * fStack_103c +
               *(float *)(uVar15 + 0x9c) * fStack_ffc + *(float *)(uVar15 + 0xcc)) *
               (float)((uint)fVar96 ^ uVar24);
          fVar74 = (*(float *)(uVar15 + 0x40) * local_1038 +
                   local_ff8 * local_1048 +
                   *(float *)(uVar15 + 0xa0) * local_1008 + *(float *)(uVar15 + 0xd0)) *
                   (float)((uint)fVar97 ^ uVar21);
          fVar65 = (*(float *)(uVar15 + 0x44) * fStack_1034 +
                   fStack_ff4 * fStack_1044 +
                   *(float *)(uVar15 + 0xa4) * fStack_1004 + *(float *)(uVar15 + 0xd4)) *
                   (float)((uint)fVar98 ^ uVar22);
          auVar50._0_8_ = CONCAT44(fVar65,fVar74);
          auVar50._8_4_ =
               (*(float *)(uVar15 + 0x48) * fStack_1030 +
               fStack_ff0 * fStack_1040 +
               *(float *)(uVar15 + 0xa8) * fStack_1000 + *(float *)(uVar15 + 0xd8)) *
               (float)((uint)fVar90 ^ uVar23);
          auVar50._12_4_ =
               (*(float *)(uVar15 + 0x4c) * fStack_102c +
               fStack_fec * fStack_103c +
               *(float *)(uVar15 + 0xac) * fStack_ffc + *(float *)(uVar15 + 0xdc)) *
               (float)((uint)fVar92 ^ uVar24);
          fVar75 = fVar75 + fVar66;
          fVar71 = fVar71 + fVar67;
          fVar72 = fVar72 + auVar62._8_4_;
          fVar73 = fVar73 + auVar62._12_4_;
          auVar81._0_4_ = fVar77 + fVar27;
          auVar81._4_4_ = fVar78 + fVar46;
          auVar81._8_4_ = fVar95 + auVar43._8_4_;
          auVar81._12_4_ = fVar96 + auVar43._12_4_;
          auVar87._0_4_ = fVar97 + fVar74;
          auVar87._4_4_ = fVar98 + fVar65;
          auVar87._8_4_ = fVar90 + auVar50._8_4_;
          auVar87._12_4_ = fVar92 + auVar50._12_4_;
          auVar34._8_4_ = auVar43._8_4_;
          auVar34._0_8_ = auVar43._0_8_;
          auVar34._12_4_ = auVar43._12_4_;
          auVar54 = minps(auVar34,auVar81);
          auVar57._8_4_ = auVar50._8_4_;
          auVar57._0_8_ = auVar50._0_8_;
          auVar57._12_4_ = auVar50._12_4_;
          auVar42 = minps(auVar57,auVar87);
          auVar54 = maxps(auVar54,auVar42);
          auVar58._8_4_ = auVar62._8_4_;
          auVar58._0_8_ = auVar62._0_8_;
          auVar58._12_4_ = auVar62._12_4_;
          auVar9._4_4_ = fVar71;
          auVar9._0_4_ = fVar75;
          auVar9._8_4_ = fVar72;
          auVar9._12_4_ = fVar73;
          auVar64 = minps(auVar58,auVar9);
          auVar10._4_4_ = fVar71;
          auVar10._0_4_ = fVar75;
          auVar10._8_4_ = fVar72;
          auVar10._12_4_ = fVar73;
          auVar70 = maxps(auVar62,auVar10);
          auVar42 = maxps(auVar43,auVar81);
          auVar49 = maxps(auVar50,auVar87);
          auVar42 = minps(auVar42,auVar49);
          auVar12._4_4_ = fStack_1014;
          auVar12._0_4_ = local_1018;
          auVar12._8_4_ = fStack_1010;
          auVar12._12_4_ = fStack_100c;
          auVar49 = maxps(auVar12,auVar64);
          local_1098 = maxps(auVar49,auVar54);
          auVar35._4_4_ = fVar26;
          auVar35._0_4_ = fVar29;
          auVar35._8_4_ = fVar28;
          auVar35._12_4_ = fVar25;
          auVar54 = minps(auVar35,auVar70);
          auVar54 = minps(auVar54,auVar42);
          auVar51._4_4_ = -(uint)(local_1098._4_4_ <= auVar54._4_4_);
          auVar51._0_4_ = -(uint)(local_1098._0_4_ <= auVar54._0_4_);
          auVar51._8_4_ = -(uint)(local_1098._8_4_ <= auVar54._8_4_);
          auVar51._12_4_ = -(uint)(local_1098._12_4_ <= auVar54._12_4_);
          uVar21 = movmskps((int)context,auVar51);
          fVar27 = local_1018;
          fVar46 = fStack_1014;
          fVar74 = fStack_1010;
          fVar65 = fStack_100c;
          fVar66 = local_1058;
          fVar67 = fStack_1054;
          fVar75 = fStack_1050;
          fVar71 = fStack_104c;
          fVar72 = local_1038;
          fVar73 = fStack_1034;
          fVar77 = fStack_1030;
          fVar78 = fStack_102c;
          fVar95 = local_1048;
          fVar96 = fStack_1044;
          fVar97 = fStack_1040;
          fVar98 = fStack_103c;
          fVar90 = local_1008;
          fVar92 = fStack_1004;
          fVar93 = fStack_1000;
          fVar94 = fStack_ffc;
          fVar79 = local_1028;
          fVar82 = fStack_1024;
          fVar83 = fStack_1020;
          fVar84 = fStack_101c;
          fVar85 = local_1068;
          fVar88 = fStack_1064;
          fVar89 = fStack_1060;
          fVar91 = fStack_105c;
        }
        context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar21);
        if (context == (RayQueryContext *)0x0) goto LAB_00566422;
        uVar15 = uVar14 & 0xfffffffffffffff0;
        lVar5 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar14 = *(ulong *)(uVar15 + lVar5 * 8);
        uVar21 = uVar21 - 1 & uVar21;
        if (uVar21 != 0) {
          uVar22 = *(uint *)(local_1098 + lVar5 * 4);
          lVar5 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar4 = *(ulong *)(uVar15 + lVar5 * 8);
          uVar23 = *(uint *)(local_1098 + lVar5 * 4);
          uVar21 = uVar21 - 1 & uVar21;
          context = (RayQueryContext *)(ulong)uVar21;
          if (uVar21 == 0) {
            if (uVar22 < uVar23) {
              *(ulong *)*pauVar18 = uVar4;
              *(uint *)((long)*pauVar18 + 8) = uVar23;
              pauVar18 = pauVar18 + 1;
            }
            else {
              *(ulong *)*pauVar18 = uVar14;
              *(uint *)((long)*pauVar18 + 8) = uVar22;
              uVar14 = uVar4;
              pauVar18 = pauVar18 + 1;
            }
          }
          else {
            auVar36._8_4_ = uVar22;
            auVar36._0_8_ = uVar14;
            auVar36._12_4_ = 0;
            auVar44._8_4_ = uVar23;
            auVar44._0_8_ = uVar4;
            auVar44._12_4_ = 0;
            lVar5 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar14 = *(ulong *)(uVar15 + lVar5 * 8);
            iVar2 = *(int *)(local_1098 + lVar5 * 4);
            auVar52._8_4_ = iVar2;
            auVar52._0_8_ = uVar14;
            auVar52._12_4_ = 0;
            auVar59._8_4_ = -(uint)((int)uVar22 < (int)uVar23);
            uVar21 = uVar21 - 1 & uVar21;
            if (uVar21 == 0) {
              auVar59._4_4_ = auVar59._8_4_;
              auVar59._0_4_ = auVar59._8_4_;
              auVar59._12_4_ = auVar59._8_4_;
              auVar54 = auVar36 & auVar59 | ~auVar59 & auVar44;
              auVar42 = auVar44 & auVar59 | ~auVar59 & auVar36;
              auVar60._8_4_ = -(uint)(auVar54._8_4_ < iVar2);
              auVar60._0_8_ = CONCAT44(auVar60._8_4_,auVar60._8_4_);
              auVar60._12_4_ = auVar60._8_4_;
              uVar14 = ~auVar60._0_8_ & uVar14 | auVar54._0_8_ & auVar60._0_8_;
              auVar54 = auVar52 & auVar60 | ~auVar60 & auVar54;
              auVar37._8_4_ = -(uint)(auVar42._8_4_ < auVar54._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              *pauVar18 = ~auVar37 & auVar42 | auVar54 & auVar37;
              pauVar18[1] = auVar42 & auVar37 | ~auVar37 & auVar54;
              pauVar18 = pauVar18 + 2;
            }
            else {
              lVar5 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              iVar3 = *(int *)(local_1098 + lVar5 * 4);
              auVar63._8_4_ = iVar3;
              auVar63._0_8_ = *(undefined8 *)(uVar15 + lVar5 * 8);
              auVar63._12_4_ = 0;
              auVar61._4_4_ = auVar59._8_4_;
              auVar61._0_4_ = auVar59._8_4_;
              auVar61._8_4_ = auVar59._8_4_;
              auVar61._12_4_ = auVar59._8_4_;
              auVar54 = auVar36 & auVar61 | ~auVar61 & auVar44;
              auVar42 = auVar44 & auVar61 | ~auVar61 & auVar36;
              auVar69._0_4_ = -(uint)(iVar2 < iVar3);
              auVar69._4_4_ = -(uint)(iVar2 < iVar3);
              auVar69._8_4_ = -(uint)(iVar2 < iVar3);
              auVar69._12_4_ = -(uint)(iVar2 < iVar3);
              auVar49 = auVar52 & auVar69 | ~auVar69 & auVar63;
              auVar70 = ~auVar69 & auVar52 | auVar63 & auVar69;
              auVar53._8_4_ = -(uint)(auVar42._8_4_ < auVar70._8_4_);
              auVar53._4_4_ = auVar53._8_4_;
              auVar53._0_4_ = auVar53._8_4_;
              auVar53._12_4_ = auVar53._8_4_;
              auVar64 = auVar42 & auVar53 | ~auVar53 & auVar70;
              auVar45._8_4_ = -(uint)(auVar54._8_4_ < auVar49._8_4_);
              auVar45._0_8_ = CONCAT44(auVar45._8_4_,auVar45._8_4_);
              auVar45._12_4_ = auVar45._8_4_;
              uVar14 = auVar54._0_8_ & auVar45._0_8_ | ~auVar45._0_8_ & auVar49._0_8_;
              auVar54 = ~auVar45 & auVar54 | auVar49 & auVar45;
              auVar38._8_4_ = -(uint)(auVar54._8_4_ < auVar64._8_4_);
              auVar38._4_4_ = auVar38._8_4_;
              auVar38._0_4_ = auVar38._8_4_;
              auVar38._12_4_ = auVar38._8_4_;
              *pauVar18 = ~auVar53 & auVar42 | auVar70 & auVar53;
              pauVar18[1] = ~auVar38 & auVar54 | auVar64 & auVar38;
              pauVar18[2] = auVar54 & auVar38 | ~auVar38 & auVar64;
              pauVar18 = pauVar18 + 3;
            }
          }
        }
        goto LAB_00566447;
      }
      goto LAB_00566422;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }